

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicString.h
# Opt level: O0

int __thiscall
bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::access
          (DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *this,char *__name,
          int __type)

{
  uint uVar1;
  int iVar2;
  reference this_00;
  reference pvVar3;
  size_t sVar4;
  int __type_00;
  undefined4 in_register_00000014;
  ulint next_i;
  uint next_node;
  bool bit;
  bool in_stack_00000047;
  size_t in_stack_00000048;
  bitvector_t<4096UL,_(bv::allocation_policy_t)0> *in_stack_00000050;
  ushort local_3a;
  undefined1 local_1;
  
  this_00 = std::
            vector<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
            ::operator[](&this->wavelet_tree,(ulong)__name & 0xffffffff);
  uVar1 = bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>::access
                    (this_00,(char *)CONCAT44(in_register_00000014,__type),__type_00);
  if ((uVar1 & 1) == 0) {
    pvVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       (&this->child0,(ulong)__name & 0xffffffff);
    local_3a = *pvVar3;
  }
  else {
    pvVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       (&this->child1,(ulong)__name & 0xffffffff);
    local_3a = *pvVar3;
  }
  uVar1 = (uint)local_3a;
  if (uVar1 < this->sigma) {
    std::
    vector<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
    ::operator[](&this->wavelet_tree,(ulong)__name & 0xffffffff);
    sVar4 = bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>::rank
                      (in_stack_00000050,in_stack_00000048,in_stack_00000047);
    iVar2 = access(this,(char *)(ulong)uVar1,(int)sVar4);
    local_1 = (undefined1)iVar2;
  }
  else {
    iVar2 = uVar1 - this->sigma;
    local_1 = (undefined1)iVar2;
  }
  return CONCAT31((int3)((uint)iVar2 >> 8),local_1);
}

Assistant:

inline symbol access(uint node, ulint i){

			bool bit = wavelet_tree[node].access(i);

			uint next_node = (bit==0?child0[node]:child1[node]);

			if(next_node>=sigma)//next node is leaf:return symbol
				return next_node-sigma;

			//else: next_node is a valid address in wavelet_tree

			ulint next_i = wavelet_tree[node].rank(i,bit);

			return access(next_node, next_i);

		}